

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# default_value_objectwriter.cc
# Opt level: O3

DefaultValueObjectWriter * __thiscall
google::protobuf::util::converter::DefaultValueObjectWriter::RenderDouble
          (DefaultValueObjectWriter *this,StringPiece name,double value)

{
  DataPiece local_38;
  
  if (this->current_ == (Node *)0x0) {
    (*this->ow_->_vptr_ObjectWriter[0xb])();
  }
  else {
    local_38._vptr_DataPiece = (_func_int **)&PTR__DataPiece_003bcd00;
    local_38.type_ = TYPE_DOUBLE;
    local_38.use_strict_base64_decoding_ = false;
    local_38.field_2.double_ = value;
    RenderDataPiece(this,name,&local_38);
  }
  return this;
}

Assistant:

DefaultValueObjectWriter* DefaultValueObjectWriter::RenderDouble(
    StringPiece name, double value) {
  if (current_ == nullptr) {
    ow_->RenderDouble(name, value);
  } else {
    RenderDataPiece(name, DataPiece(value));
  }
  return this;
}